

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O1

void kmpc_set_poolsize(size_t size)

{
  long lVar1;
  int iVar2;
  
  iVar2 = __kmp_get_global_thread_id();
  lVar1 = *(long *)(__kmp_threads[iVar2]->th_pad + 0x120);
  *(undefined8 *)(lVar1 + 0x400) = 0;
  *(code **)(lVar1 + 0x408) = malloc;
  *(code **)(lVar1 + 0x410) = free;
  *(size_t *)(lVar1 + 0x420) = size;
  return;
}

Assistant:

void kmpc_set_poolsize(size_t size) {
  bectl(__kmp_get_thread(), (bget_compact_t)0, (bget_acquire_t)malloc,
        (bget_release_t)free, (bufsize)size);
}